

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O1

void preprocessMode(Problem *problem,bool theory)

{
  Unit *this;
  pointer pcVar1;
  int iVar2;
  Formula *pFVar3;
  Unit *pUVar4;
  ostream *poVar5;
  Unit *extraout_RDX;
  Unit *unit;
  Unit *extraout_RDX_00;
  Unit *extraout_RDX_01;
  Unit *extraout_RDX_02;
  UnitList *pUVar6;
  ScopedPtr<Kernel::Problem> prb;
  Preprocess prepro;
  Inference local_78;
  Preprocess local_40;
  
  local_40._options = Lib::env;
  local_40._clausify = false;
  local_40._stillSimplify = false;
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue == PREPROCESS2) {
    local_40._clausify = false;
    local_40._stillSimplify = true;
  }
  Shell::Preprocess::preprocess(&local_40,problem);
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  pUVar6 = problem->_units;
  if (pUVar6 != (UnitList *)0x0) {
    pUVar4 = extraout_RDX;
    do {
      this = pUVar6->_head;
      pUVar6 = pUVar6->_tail;
      if ((((Lib::env->_showAll).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 !=
            '\0') ||
          (((Lib::env->_showFOOL).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 & 1)
           != 0)) ||
         (((undefined1  [48])this->_inference & (undefined1  [48])0xfe00) !=
          (undefined1  [48])0xd200)) {
        if (theory) {
          pFVar3 = Kernel::Unit::getFormula(this);
          if (((uint)*(ulong *)&this->_inference & 0x1c) == 8) {
            *(ulong *)&this->_inference = *(ulong *)&this->_inference | 0xc;
          }
          pUVar4 = (Unit *)operator_new(0x48,8);
          local_78._0_8_ = *(undefined8 *)&this->_inference;
          local_78._8_8_ = *(undefined8 *)&(this->_inference).field_0x8;
          local_78._splits = (this->_inference)._splits;
          local_78._ptr1 = (this->_inference)._ptr1;
          local_78._ptr2 = (this->_inference)._ptr2;
          local_78.th_ancestors = (this->_inference).th_ancestors;
          local_78.all_ancestors = (this->_inference).all_ancestors;
          Kernel::Unit::Unit(pUVar4,FORMULA,&local_78);
          *(Formula **)(pUVar4 + 1) = pFVar3;
          *(undefined8 *)&pUVar4[1]._inference = 3;
          Kernel::Unit::doUnitTracing(pUVar4);
          Shell::TPTPPrinter::toString_abi_cxx11_((string *)&local_78,(TPTPPrinter *)pUVar4,unit);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_78._0_8_,local_78._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          pUVar4 = extraout_RDX_00;
        }
        else {
          Shell::TPTPPrinter::toString_abi_cxx11_((string *)&local_78,(TPTPPrinter *)this,pUVar4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_78._0_8_,local_78._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          pUVar4 = extraout_RDX_01;
        }
        if ((SplitSet **)local_78._0_8_ != &local_78._splits) {
          operator_delete((void *)local_78._0_8_,(ulong)((long)&(local_78._splits)->_size + 1));
          pUVar4 = extraout_RDX_02;
        }
      }
    } while (pUVar6 != (List<Kernel::Unit_*> *)0x0);
  }
  pcVar1 = (Lib::env->_latexOutput).
           super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .actualValue._M_dataplus._M_p;
  local_78._0_8_ = &local_78._splits;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,
             pcVar1 + (Lib::env->_latexOutput).
                      super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .actualValue._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if ((SplitSet **)local_78._0_8_ != &local_78._splits) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)&(local_78._splits)->_size + 1));
  }
  if (iVar2 != 0) {
    outputProblemToLaTeX(problem);
  }
  vampireReturnValue = 0;
  if (problem != (Problem *)0x0) {
    Kernel::Problem::~Problem(problem);
    operator_delete(problem,0x110);
  }
  return;
}

Assistant:

void preprocessMode(Problem* problem, bool theory)
{
  ScopedPtr<Problem> prb(problem);

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // preprocess without clausification
  Shell::Preprocess prepro(*env.options);
  prepro.turnClausifierOff();
  if(env.options->mode() == Options::Mode::PREPROCESS2){
    prepro.keepSimplifyStep();
  }
  prepro.preprocess(*prb);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());
  while (units.hasNext()) {
    Unit* u = units.next();
    if (!env.options->showFOOL()) {
      if (u->inference().rule() == InferenceRule::FOOL_AXIOM_TRUE_NEQ_FALSE || u->inference().rule() == InferenceRule::FOOL_AXIOM_ALL_IS_TRUE_OR_FALSE) {
        continue;
      }
    }

    if (theory) {
      Formula* f = u->getFormula();

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (u->inference().inputType() == UnitInputType::CONJECTURE) {
        u->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,u->inference()); // we are stealing u's inference which is not nice
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(u) << "\n";
    }
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}